

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O3

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromData(CollationLoader *this,UErrorCode *errorCode)

{
  Locale *this_00;
  int iVar1;
  CollationTailoring *this_01;
  uint8_t *__buf;
  UChar *pUVar2;
  char *pcVar3;
  char *pcVar4;
  CollationCacheEntry *this_02;
  Locale *this_03;
  UErrorCode internalErrorCode;
  UErrorCode internalErrorCode_1;
  int32_t len;
  LocalUResourceBundlePointer binary;
  int32_t len_1;
  int32_t length;
  LocalPointerBase<UResourceBundle> local_78;
  UErrorCode local_6c;
  LocalUResourceBundlePointer local_68;
  LocalUResourceBundlePointer local_60;
  int local_58;
  uint local_54;
  ConstChar16Ptr local_50;
  Locale *local_48;
  UChar *local_40;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  this_01 = (CollationTailoring *)UMemory::operator_new((UMemory *)0x190,(size_t)errorCode);
  if ((this_01 == (CollationTailoring *)0x0) ||
     (CollationTailoring::CollationTailoring(this_01,this->rootEntry->tailoring->settings),
     this_01->settings == (CollationSettings *)0x0)) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    this_02 = (CollationCacheEntry *)0x0;
    goto LAB_00223c43;
  }
  local_60.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)
       ures_getByKey_63(this->data,"%%CollationBin",(UResourceBundle *)0x0,errorCode);
  __buf = ures_getBinary_63((UResourceBundle *)local_60.super_LocalPointerBase<UResourceBundle>.ptr,
                            (int32_t *)&local_54,errorCode);
  CollationDataReader::read((int)this->rootEntry->tailoring,__buf,(ulong)local_54);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_78.ptr = local_78.ptr & 0xffffffff00000000;
    pUVar2 = ures_getStringByKey_63
                       (this->data,"Sequence",(int32_t *)&local_68,(UErrorCode *)&local_78);
    if ((int)local_78.ptr < 1) {
      local_50.p_ = pUVar2;
      UnicodeString::setTo
                (&this_01->rules,'\x01',&local_50,
                 (int32_t)local_68.super_LocalPointerBase<UResourceBundle>.ptr);
      local_40 = local_50.p_;
    }
    this_00 = &this->locale;
    pcVar3 = Locale::getBaseName(this_00);
    local_48 = &this->validLocale;
    pcVar4 = Locale::getBaseName(local_48);
    iVar1 = strcmp(pcVar3,pcVar4);
    if (iVar1 != 0) {
      local_78.ptr = ures_open_63("icudt63l-coll",pcVar3,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&local_78);
        goto LAB_00223c2a;
      }
      local_6c = U_ZERO_ERROR;
      local_68.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKeyWithFallback_63
                     (local_78.ptr,"collations/default",(UResourceBundle *)0x0,&local_6c);
      pUVar2 = ures_getString_63((UResourceBundle *)
                                 local_68.super_LocalPointerBase<UResourceBundle>.ptr,&local_58,
                                 &local_6c);
      if (local_58 < 0x10 && local_6c < U_ILLEGAL_ARGUMENT_ERROR) {
        u_UCharsToChars_63(pUVar2,this->defaultType,local_58 + 1);
      }
      else {
        builtin_strncpy(this->defaultType,"standard",9);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_68);
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_78);
    }
    this_03 = &this_01->actualLocale;
    Locale::operator=(this_03,this_00);
    iVar1 = strcmp(this->type,this->defaultType);
    if (iVar1 == 0) {
      pcVar3 = (this->locale).fullName;
      pcVar4 = Locale::getBaseName(this_00);
      iVar1 = strcmp(pcVar3,pcVar4);
      if (iVar1 != 0) {
        pcVar4 = "collation";
        Locale::setKeywordValue(this_03,"collation",(char *)0x0,errorCode);
      }
    }
    else {
      pcVar4 = "collation";
      Locale::setKeywordValue(this_03,"collation",this->type,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) goto LAB_00223c2a;
    if (this->typeFallback != '\0') {
      *errorCode = U_USING_DEFAULT_WARNING;
    }
    this_01->bundle = this->bundle;
    this->bundle = (UResourceBundle *)0x0;
    this_02 = (CollationCacheEntry *)UMemory::operator_new((UMemory *)0x100,(size_t)pcVar4);
    if (this_02 == (CollationCacheEntry *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_00223c2a;
    }
    CollationCacheEntry::CollationCacheEntry(this_02,local_48,this_01);
    SharedObject::addRef((SharedObject *)this_02);
    this_01 = (CollationTailoring *)0x0;
  }
  else {
LAB_00223c2a:
    this_02 = (CollationCacheEntry *)0x0;
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_60);
LAB_00223c43:
  if (this_01 != (CollationTailoring *)0x0) {
    (*(this_01->super_SharedObject).super_UObject._vptr_UObject[1])(this_01);
  }
  return this_02;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}